

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyManager::CleanupDependencies
          (DependencyManager *this,CatalogTransaction transaction,CatalogEntry *object)

{
  pointer pDVar1;
  DependencyInfo *dep;
  pointer info_00;
  vector<duckdb::DependencyInfo,_true> to_remove;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  CatalogEntryInfo info;
  
  to_remove.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  to_remove.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  to_remove.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
  super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLookupProperties(&info,object);
  local_88._8_8_ = 0;
  local_70 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:342:15)>
             ::_M_invoke;
  local_78 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:342:15)>
             ::_M_manager;
  local_88._M_unused._M_object = &to_remove;
  ScanSetInternal(this,transaction,&info,true,(dependency_callback_t *)&local_88);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
  local_88._8_8_ = 0;
  local_70 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:344:17)>
             ::_M_invoke;
  local_78 = ::std::
             _Function_handler<void_(duckdb::DependencyEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/catalog/dependency_manager.cpp:344:17)>
             ::_M_manager;
  local_88._M_unused._M_object = &to_remove;
  ScanSetInternal(this,transaction,&info,false,(dependency_callback_t *)&local_88);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_88);
  pDVar1 = to_remove.super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
           super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (info_00 = to_remove.
                 super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>.
                 super__Vector_base<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; info_00 != pDVar1; info_00 = info_00 + 1
      ) {
    RemoveDependency(this,transaction,info_00);
  }
  CatalogEntryInfo::~CatalogEntryInfo(&info);
  ::std::vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>::~vector
            (&to_remove.
              super_vector<duckdb::DependencyInfo,_std::allocator<duckdb::DependencyInfo>_>);
  return;
}

Assistant:

void DependencyManager::CleanupDependencies(CatalogTransaction transaction, CatalogEntry &object) {
	// Collect the dependencies
	vector<DependencyInfo> to_remove;

	auto info = GetLookupProperties(object);
	ScanSubjects(transaction, info,
	             [&](DependencyEntry &dep) { to_remove.push_back(DependencyInfo::FromSubject(dep)); });
	ScanDependents(transaction, info,
	               [&](DependencyEntry &dep) { to_remove.push_back(DependencyInfo::FromDependent(dep)); });

	// Remove the dependency entries
	for (auto &dep : to_remove) {
		RemoveDependency(transaction, dep);
	}
}